

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O2

void __thiscall Trick::print_trick(Trick *this)

{
  ostream *poVar1;
  Card *pCVar2;
  Card card;
  Card local_58;
  string local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Printing trick....");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (pCVar2 = (Card *)(this->m_trick_pile).
                        super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 != (Card *)(this->m_trick_pile).
                        super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      pCVar2 = (Card *)&pCVar2[1].m_rank) {
    local_58 = *pCVar2;
    poVar1 = std::operator<<((ostream *)&std::cout,"Card is ");
    Card::Card2Str_abi_cxx11_(&local_50,&local_58);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"....");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Trick::print_trick()
{
    std::cout << "Printing trick...." << std::endl;
    for(std::vector<player_move>::iterator it = m_trick_pile.begin(); it != m_trick_pile.end(); ++it) {
        Card card = std::get<1>(*it);
        std::cout << "Card is " << card.Card2Str() << std::endl;
    }
    std::cout << "...." << std::endl;
}